

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_ring_lines(rf_vec2 center,float inner_radius,float outer_radius,int start_angle,
                       int end_angle,int segments,rf_color color)

{
  rf_render_batch *prVar1;
  rf_vertex_buffer *prVar2;
  int iVar3;
  uchar w;
  uchar z;
  int iVar4;
  uchar x;
  long lVar5;
  int end_angle_00;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float __x;
  float local_94;
  uchar local_88;
  
  if (start_angle == end_angle) {
    return;
  }
  fVar6 = center.x;
  fVar11 = center.y;
  fVar10 = (float)(~-(uint)(outer_radius < inner_radius) & (uint)outer_radius |
                  (~-(uint)(0.0 < inner_radius) & 0x3dcccccd |
                  -(uint)(0.0 < inner_radius) & (uint)inner_radius) &
                  -(uint)(outer_radius < inner_radius));
  end_angle_00 = start_angle;
  if (start_angle < end_angle) {
    end_angle_00 = end_angle;
  }
  if (inner_radius <= outer_radius) {
    outer_radius = inner_radius;
  }
  if (end_angle < start_angle) {
    start_angle = end_angle;
  }
  if (segments < 4) {
    fVar7 = -0.5 / fVar10 + 1.0;
    fVar7 = fVar7 * fVar7;
    fVar7 = acosf(fVar7 + fVar7 + -1.0);
    fVar7 = ceilf(6.2831855 / fVar7);
    iVar3 = (int)((fVar7 * (float)(end_angle_00 - start_angle)) / 360.0);
    segments = 4;
    if (0 < iVar3) {
      segments = iVar3;
    }
  }
  if (0.0 < outer_radius) {
    iVar4 = (end_angle_00 - start_angle) % 0x168;
    iVar3 = segments * 4 + 4;
    if (iVar4 == 0) {
      iVar3 = segments * 4;
    }
    prVar1 = (rf__ctx->field_0).current_batch;
    lVar5 = prVar1->current_buffer;
    prVar2 = prVar1->vertex_buffers;
    if (prVar2[lVar5].elements_count * 4 <= iVar3 + prVar2[lVar5].v_counter) {
      rf_gfx_draw();
    }
    local_94 = (float)start_angle;
    rf_gfx_begin(RF_LINES);
    local_88 = color.g;
    w = color.a;
    z = color.b;
    x = color.r;
    if (iVar4 != 0) {
      rf_gfx_color4ub(x,local_88,z,w);
      fVar7 = local_94 * 0.017453292;
      fVar8 = sinf(fVar7);
      fVar9 = cosf(fVar7);
      rf_gfx_vertex3f(fVar8 * fVar10 + fVar6,fVar9 * fVar10 + fVar11,
                      ((rf__ctx->field_0).current_batch)->current_depth);
      fVar8 = sinf(fVar7);
      fVar7 = cosf(fVar7);
      rf_gfx_vertex3f(fVar8 * outer_radius + fVar6,fVar7 * outer_radius + fVar11,
                      ((rf__ctx->field_0).current_batch)->current_depth);
    }
    if (0 < segments) {
      lVar5 = (long)segments;
      do {
        rf_gfx_color4ub(x,local_88,z,w);
        __x = local_94 * 0.017453292;
        fVar7 = sinf(__x);
        fVar8 = cosf(__x);
        rf_gfx_vertex3f(fVar7 * fVar10 + fVar6,fVar8 * fVar10 + fVar11,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        local_94 = local_94 + (float)(end_angle_00 - start_angle) / (float)segments;
        fVar7 = local_94 * 0.017453292;
        fVar8 = sinf(fVar7);
        fVar9 = cosf(fVar7);
        rf_gfx_vertex3f(fVar8 * fVar10 + fVar6,fVar9 * fVar10 + fVar11,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        fVar8 = sinf(__x);
        fVar9 = cosf(__x);
        rf_gfx_vertex3f(fVar8 * outer_radius + fVar6,fVar9 * outer_radius + fVar11,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        fVar8 = sinf(fVar7);
        fVar7 = cosf(fVar7);
        rf_gfx_vertex3f(fVar8 * outer_radius + fVar6,fVar7 * outer_radius + fVar11,
                        ((rf__ctx->field_0).current_batch)->current_depth);
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    if (iVar4 != 0) {
      rf_gfx_color4ub(x,local_88,z,w);
      local_94 = local_94 * 0.017453292;
      fVar7 = sinf(local_94);
      fVar8 = cosf(local_94);
      rf_gfx_vertex3f(fVar7 * fVar10 + fVar6,fVar10 * fVar8 + fVar11,
                      ((rf__ctx->field_0).current_batch)->current_depth);
      fVar10 = sinf(local_94);
      fVar7 = cosf(local_94);
      rf_gfx_vertex3f(fVar10 * outer_radius + fVar6,outer_radius * fVar7 + fVar11,
                      ((rf__ctx->field_0).current_batch)->current_depth);
    }
    rf_gfx_end();
    return;
  }
  rf_draw_circle_sector_lines(center,fVar10,start_angle,end_angle_00,segments,color);
  return;
}

Assistant:

RF_API void rf_draw_ring_lines(rf_vec2 center, float inner_radius, float outer_radius, int start_angle, int end_angle, int segments, rf_color color)
{
    if (start_angle == end_angle) return;

    // Function expects (outerRadius > innerRadius)
    if (outer_radius < inner_radius)
    {
        float tmp = outer_radius;
        outer_radius = inner_radius;
        inner_radius = tmp;

        if (outer_radius <= 0.0f) outer_radius = 0.1f;
    }

    // Function expects (endAngle > start_angle)
    if (end_angle < start_angle)
    {
        // Swap values
        int tmp = start_angle;
        start_angle = end_angle;
        end_angle = tmp;
    }

    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/outer_radius, 2) - 1);
        segments = (end_angle - start_angle) * ceilf(2 * RF_PI / th) / 360;

        if (segments <= 0) segments = 4;
    }

    if (inner_radius <= 0.0f)
    {
        rf_draw_circle_sector_lines(center, outer_radius, start_angle, end_angle, segments, color);
        return;
    }

    float step_length = (float)(end_angle - start_angle)/(float)segments;
    float angle = start_angle;

    bool show_cap_lines = true;
    int limit = 4 * (segments + 1);
    if ((end_angle - start_angle)%360 == 0) { limit = 4 * segments; show_cap_lines = false; }

    if (rf_gfx_check_buffer_limit(limit)) rf_gfx_draw();

    rf_gfx_begin(RF_LINES);
    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
    }

    for (rf_int i = 0; i < segments; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

        angle += step_length;
    }

    if (show_cap_lines)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
        rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
    }
    rf_gfx_end();
}